

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall
glu::ShaderProgram::ShaderProgram
          (ShaderProgram *this,RenderContext *renderCtx,ProgramSources *sources)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ShaderProgram *local_38;
  ProgramSources *sources_local;
  RenderContext *renderCtx_local;
  ShaderProgram *this_local;
  
  local_38 = this;
  do {
    std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::vector(local_38->m_shaders);
    local_38 = (ShaderProgram *)(local_38->m_shaders + 1);
  } while (local_38 != (ShaderProgram *)&this->m_program);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  Program::Program(&this->m_program,(Functions *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  init(this,(EVP_PKEY_CTX *)CONCAT44(extraout_var_00,iVar1));
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const RenderContext& renderCtx, const ProgramSources& sources)
	: m_program(renderCtx.getFunctions())
{
	init(renderCtx.getFunctions(), sources);
}